

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.c
# Opt level: O1

uint64_t readUint64InBigEndian(void *memory)

{
  ulong uVar1;
  
  uVar1 = *memory;
  return uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
}

Assistant:

uint64_t readUint64InBigEndian(void* memory)
{
	uint8_t* p = memory;
	return (((uint64_t)p[0]) << 56) | 
		   (((uint64_t)p[1]) << 48) |
		   (((uint64_t)p[2]) << 40) |
		   (((uint64_t)p[3]) << 32) |
		   (((uint64_t)p[4]) << 24) | 
		   (((uint64_t)p[5]) << 16) |
		   (((uint64_t)p[6]) <<  8) |
		   (((uint64_t)p[7]));
}